

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O2

void pce_mml(int *ip)

{
  char cVar1;
  ushort *puVar2;
  int iVar3;
  int iVar4;
  ushort **ppuVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  int local_bc;
  char mml [128];
  
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar3 = mml_start(buffer);
  local_bc = 0x2000 - iVar3;
  while( true ) {
    iVar4 = getstring(ip,mml,0x7f);
    if (iVar4 == 0) {
      return;
    }
    iVar4 = mml_parse(buffer + iVar3,local_bc,mml);
    if (iVar4 == -1) {
      return;
    }
    iVar3 = iVar3 + iVar4;
    iVar6 = *ip;
    *ip = iVar6 + 1;
    cVar1 = prlnbuf[iVar6];
    if (cVar1 != ',') break;
    local_bc = local_bc - iVar4;
    ppuVar5 = __ctype_b_loc();
    puVar2 = *ppuVar5;
    lVar8 = (long)(iVar6 + 1);
    iVar6 = iVar6 + 2;
    pcVar7 = prlnbuf + lVar8;
    while( true ) {
      pcVar7 = pcVar7 + 1;
      if ((*(byte *)((long)puVar2 + (long)prlnbuf[lVar8] * 2 + 1) & 0x20) == 0) break;
      lVar8 = lVar8 + 1;
      *ip = iVar6;
      iVar6 = iVar6 + 1;
    }
    if (prlnbuf[lVar8] == '\\') {
      do {
        *ip = iVar6;
        cVar1 = *pcVar7;
        pcVar7 = pcVar7 + 1;
        iVar6 = iVar6 + 1;
      } while ((*(byte *)((long)puVar2 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      if ((cVar1 != ';') && (cVar1 != '\0')) {
LAB_00110630:
        error("Syntax error!");
        return;
      }
      if (pass == 1) {
        println();
        clearln();
      }
      iVar4 = readline();
      if (iVar4 == -1) {
        return;
      }
      *ip = 0x1a;
    }
  }
  if ((cVar1 == '\0') || (cVar1 == ';')) {
    iVar4 = mml_stop(buffer + iVar3);
    putbuffer(buffer,iVar3 + iVar4);
    if (pass != 1) {
      return;
    }
    println();
    return;
  }
  goto LAB_00110630;
}

Assistant:

void
pce_mml(int *ip)
{
	int offset, bufsize, size;
	char mml[128];
	char c;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* start */
	bufsize = 8192;
	offset = mml_start(buffer);
	bufsize -= offset;

	/* extract and parse mml string(s) */
	for (;;) {
		/* get string */
		if (!getstring(ip, mml, 127))
			return;

		/* parse string */
		size = mml_parse(buffer + offset, bufsize, mml);

		if (size == -1)
			return;

		/* adjust buffer size */
		offset  += size;
		bufsize -= size;

		/* next string */
		c = prlnbuf[(*ip)++];

		if ((c != ',') && (c != ';') && (c != '\0')) {
			error("Syntax error!");
			return;
		}
		if (c != ',')
			break;

		/* skip spaces */
		while (isspace(prlnbuf[*ip]))
			(*ip)++;

		/* continuation char */
		if (prlnbuf[*ip] == '\\') {
			(*ip)++;

			/* skip spaces */
			while (isspace(prlnbuf[*ip]))
				(*ip)++;

			/* check */
			if (prlnbuf[*ip] == ';' || prlnbuf[*ip] == '\0') {
				/* output line */
				if (pass == LAST_PASS) {
					println();
					clearln();
				}

				/* read a new line */
				if (readline() == -1)
					return;
				
				/* rewind line pointer and continue */
				*ip = SFIELD;
			}
			else {
				error("Syntax error!");
				return;
			}
		}
	}			

	/* stop */
	offset += mml_stop(buffer + offset);

	/* store data */
	putbuffer(buffer, offset);

	/* output */
	if (pass == LAST_PASS)
		println();
}